

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalHashJoin::Finalize
          (PhysicalHashJoin *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
  *this_00;
  vector<duckdb::JoinCondition,_true> *this_01;
  unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
  *this_02;
  long lVar1;
  HashJoinGlobalSinkState *this_03;
  _Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false> __ptr;
  _Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  __ptr_00;
  pointer puVar2;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *puVar3;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *puVar4;
  byte bVar5;
  type this_04;
  pointer pTVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  uint64_t uVar10;
  pointer pTVar11;
  idx_t *piVar12;
  ClientContext *context_00;
  PhysicalOperator *op;
  pointer pDVar13;
  reference pvVar14;
  const_reference pvVar15;
  pointer pEVar16;
  pointer pPVar17;
  reference other;
  type pJVar18;
  pointer this_05;
  uint64_t uVar19;
  SinkFinalizeType SVar20;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *local_ht;
  pointer puVar21;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *puVar22;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *local_ht_1;
  PhysicalHashJoin *op_00;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> final_min_max;
  Value max;
  value_type key_type;
  Value min;
  undefined1 local_158 [32];
  Value local_138;
  Value local_f8;
  shared_ptr<duckdb::Event,_true> local_b8;
  LogicalType local_a0;
  Value local_88;
  LogicalType local_48;
  
  this_03 = (HashJoinGlobalSinkState *)input->global_state;
  local_158._8_8_ = pipeline;
  local_158._16_8_ = event;
  local_158._24_8_ = this;
  this_04 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
            operator*(&this_03->hash_table);
  this_00 = &this_03->temporary_memory_state;
  pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  TemporaryMemoryState::UpdateReservation(pTVar6,context);
  pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  iVar7 = TemporaryMemoryState::GetReservation(pTVar6);
  bVar23 = iVar7 < this_03->total_size;
  this_03->external = bVar23;
  if (bVar23) {
    this_04->load_factor = 1.5;
    iVar7 = JoinHashTable::GetTotalSize
                      (this_04,&this_03->local_hash_tables,(idx_t *)&local_88,
                       (idx_t *)(local_158 + 0x20));
    pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(this_00);
    iVar8 = TemporaryMemoryState::GetReservation(pTVar6);
    if (iVar7 < iVar8) {
      pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      TemporaryMemoryState::SetMinimumReservation(pTVar6,iVar7);
      pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      TemporaryMemoryState::SetRemainingSizeAndUpdateReservation(pTVar6,context,iVar7);
      this_03->total_size = iVar7;
      this_03->max_partition_size = local_88.type_._0_8_;
      this_03->max_partition_count = local_138.type_._0_8_;
      this_03->external = false;
    }
  }
  if (this_03->external != true) {
    puVar2 = (this_03->local_hash_tables).
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar21 = (this_03->local_hash_tables).
                   super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
        puVar21 = puVar21 + 1) {
      pJVar18 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                ::operator*(puVar21);
      JoinHashTable::Merge(this_04,pJVar18);
    }
    puVar3 = &((this_03->local_hash_tables).
               super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>;
    puVar4 = &((this_03->local_hash_tables).
               super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>;
    puVar22 = puVar3;
    if (puVar4 != puVar3) {
      do {
        ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::
        ~unique_ptr(puVar22);
        puVar22 = puVar22 + 1;
      } while (puVar22 != puVar4);
      (this_03->local_hash_tables).
      super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3;
    }
    JoinHashTable::Unpartition(this_04);
    LogicalType::LogicalType(&local_48,SQLNULL);
    Value::Value(&local_88,&local_48);
    LogicalType::~LogicalType(&local_48);
    LogicalType::LogicalType(&local_a0,SQLNULL);
    op_00 = (PhysicalHashJoin *)local_158._24_8_;
    Value::Value((Value *)(local_158 + 0x20),&local_a0);
    LogicalType::~LogicalType(&local_a0);
    if (((op_00->super_PhysicalComparisonJoin).filter_pushdown.
         super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
         .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl !=
         (JoinFilterPushdownInfo *)0x0) && (this_03->skip_filter_pushdown == false)) {
      pTVar11 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                ::operator->(&this_04->data_collection);
      piVar12 = TupleDataCollection::Count(pTVar11);
      if (*piVar12 != 0) {
        context_00 = (ClientContext *)
                     unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                     ::operator->(&(op_00->super_PhysicalComparisonJoin).filter_pushdown);
        op = (PhysicalOperator *)
             unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
             ::operator*(&this_03->global_filter_state);
        JoinFilterPushdownInfo::Finalize
                  ((JoinFilterPushdownInfo *)local_158,context_00,(JoinHashTable *)context,
                   (JoinFilterGlobalState *)this_04,op);
        pDVar13 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                              *)local_158);
        pvVar14 = vector<duckdb::Vector,_true>::operator[](&pDVar13->data,0);
        Vector::GetValue(&local_f8,pvVar14,0);
        Value::operator=(&local_88,&local_f8);
        Value::~Value(&local_f8);
        pDVar13 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                              *)local_158);
        pvVar14 = vector<duckdb::Vector,_true>::operator[](&pDVar13->data,1);
        Vector::GetValue(&local_f8,pvVar14,0);
        Value::operator=((Value *)(local_158 + 0x20),&local_f8);
        Value::~Value(&local_f8);
        if ((tuple<duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)local_158._0_8_ !=
            (_Head_base<0UL,_duckdb::DataChunk_*,_false>)0x0) {
          DataChunk::~DataChunk((DataChunk *)local_158._0_8_);
          operator_delete((void *)local_158._0_8_);
        }
        goto LAB_01561ef7;
      }
    }
    this_01 = &(op_00->super_PhysicalComparisonJoin).conditions;
    pvVar15 = vector<duckdb::JoinCondition,_true>::operator[](this_01,0);
    pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pvVar15->right);
    bVar23 = TypeIsIntegral((pEVar16->return_type).physical_type_);
    if (bVar23) {
      pvVar15 = vector<duckdb::JoinCondition,_true>::operator[](this_01,0);
      pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar15->right);
      Value::MinimumValue(&local_f8,&pEVar16->return_type);
      Value::operator=(&local_88,&local_f8);
      Value::~Value(&local_f8);
      pvVar15 = vector<duckdb::JoinCondition,_true>::operator[](this_01,0);
      pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar15->right);
      Value::MaximumValue(&local_f8,&pEVar16->return_type);
      Value::operator=((Value *)(local_158 + 0x20),&local_f8);
      Value::~Value(&local_f8);
      op_00 = (PhysicalHashJoin *)local_158._24_8_;
    }
LAB_01561ef7:
    this_02 = &this_03->perfect_join_executor;
    pPVar17 = unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
              ::operator->(this_02);
    bVar23 = PerfectHashJoinExecutor::CanDoPerfectHashJoin
                       (pPVar17,op_00,&local_88,(Value *)(local_158 + 0x20));
    if (bVar23) {
      other = vector<duckdb::LogicalType,_true>::operator[](&this_04->equality_types,0);
      LogicalType::LogicalType(&local_f8.type_,other);
      pPVar17 = unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>,_true>
                ::operator->(this_02);
      bVar23 = PerfectHashJoinExecutor::BuildPerfectHashTable(pPVar17,&local_f8.type_);
      LogicalType::~LogicalType(&local_f8.type_);
    }
    if (bVar23 == false) {
      __ptr_00.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl =
           (this_02->
           super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
           .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>;
      (this_02->
      super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
      .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false> =
           (_Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>)0x0;
      if (__ptr_00.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl !=
          (PerfectHashJoinExecutor *)0x0) {
        ::std::default_delete<duckdb::PerfectHashJoinExecutor>::operator()
                  ((default_delete<duckdb::PerfectHashJoinExecutor> *)this_02,
                   (PerfectHashJoinExecutor *)
                   __ptr_00.super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>.
                   _M_head_impl);
      }
      HashJoinGlobalSinkState::ScheduleFinalize
                (this_03,(Pipeline *)local_158._8_8_,(Event *)local_158._16_8_);
    }
    this_03->finalized = true;
    pTVar11 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(&this_04->data_collection);
    piVar12 = TupleDataCollection::Count(pTVar11);
    if ((*piVar12 == 0) &&
       (bVar5 = (op_00->super_PhysicalComparisonJoin).super_PhysicalJoin.
                super_CachingPhysicalOperator.field_0x81 - 2, bVar5 < 9)) {
      SVar20 = (&DAT_01e2e8c2)[bVar5];
    }
    else {
      SVar20 = READY;
    }
    Value::~Value((Value *)(local_158 + 0x20));
    Value::~Value(&local_88);
    return SVar20;
  }
  __ptr._M_head_impl =
       (this_03->perfect_join_executor).
       super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl;
  (this_03->perfect_join_executor).
  super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl =
       (PerfectHashJoinExecutor *)0x0;
  if (__ptr._M_head_impl != (PerfectHashJoinExecutor *)0x0) {
    ::std::default_delete<duckdb::PerfectHashJoinExecutor>::operator()
              ((default_delete<duckdb::PerfectHashJoinExecutor> *)&this_03->perfect_join_executor,
               __ptr._M_head_impl);
  }
  iVar7 = this_03->max_partition_size;
  auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)this_03->max_partition_count);
  auVar24._8_4_ = (int)(this_03->max_partition_count >> 0x20);
  auVar24._12_4_ = 0x45300000;
  dVar27 = ((auVar24._8_8_ - 1.9342813113834067e+25) + (auVar24._0_8_ - 4503599627370496.0)) *
           this_04->load_factor;
  uVar9 = (ulong)dVar27;
  uVar10 = NextPowerOfTwo((long)(dVar27 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
  uVar19 = 0x4000;
  if (0x4000 < uVar10) {
    uVar19 = uVar10;
  }
  lVar1 = iVar7 + uVar19 * 8;
  auVar25._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar25._0_8_ = lVar1;
  auVar25._12_4_ = 0x45300000;
  iVar7 = this_03->total_size;
  auVar26._8_4_ = (int)(iVar7 >> 0x20);
  auVar26._0_8_ = iVar7;
  auVar26._12_4_ = 0x45300000;
  if ((auVar25._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0) <
      ((auVar26._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)iVar7) - 4503599627370496.0)) * 0.8) {
    iVar7 = this_03->probe_side_requirement;
    pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
             ::operator->(this_00);
    iVar8 = TemporaryMemoryState::GetReservation(pTVar6);
    if (iVar8 < lVar1 + iVar7) {
      pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
               ::operator->(this_00);
      iVar7 = TemporaryMemoryState::GetReservation(pTVar6);
      JoinHashTable::SetRepartitionRadixBits
                (this_04,iVar7,this_03->max_partition_size,this_03->max_partition_count);
      local_88.type_.id_ = INVALID;
      local_88.type_.physical_type_ = ~INVALID;
      local_88.type_._2_6_ = 0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::HashJoinRepartitionEvent,std::allocator<duckdb::HashJoinRepartitionEvent>,duckdb::Pipeline&,duckdb::PhysicalHashJoin_const&,duckdb::HashJoinGlobalSinkState&,duckdb::vector<duckdb::unique_ptr<duckdb::JoinHashTable,std::default_delete<duckdb::JoinHashTable>,true>,true>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_,
                 (HashJoinRepartitionEvent **)&local_88,
                 (allocator<duckdb::HashJoinRepartitionEvent> *)&local_f8,
                 (Pipeline *)local_158._8_8_,(PhysicalHashJoin *)local_158._24_8_,this_03,
                 &this_03->local_hash_tables);
      shared_ptr<duckdb::HashJoinRepartitionEvent,_true>::shared_ptr
                ((shared_ptr<duckdb::HashJoinRepartitionEvent,_true> *)(local_158 + 0x20),
                 (shared_ptr<duckdb::HashJoinRepartitionEvent> *)&local_88);
      if (local_88.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_138.type_._0_8_;
      local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_138.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_138.type_._0_8_ = (pointer)0x0;
      local_138.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      Event::InsertEvent((Event *)local_158._16_8_,&local_b8);
      if (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_138.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_138.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      goto LAB_01562082;
    }
  }
  puVar2 = (this_03->local_hash_tables).
           super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (this_03->local_hash_tables).
                 super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2; puVar21 = puVar21 + 1
      ) {
    pJVar18 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
              operator*(puVar21);
    JoinHashTable::Merge(this_04,pJVar18);
  }
  puVar3 = &((this_03->local_hash_tables).
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>;
  puVar4 = &((this_03->local_hash_tables).
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>;
  puVar22 = puVar3;
  if (puVar4 != puVar3) {
    do {
      ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::
      ~unique_ptr(puVar22);
      puVar22 = puVar22 + 1;
    } while (puVar22 != puVar4);
    (this_03->local_hash_tables).
    super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3;
  }
  this_05 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
            operator->(&this_03->hash_table);
  pTVar6 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
           ::operator->(this_00);
  iVar7 = TemporaryMemoryState::GetReservation(pTVar6);
  JoinHashTable::PrepareExternalFinalize(this_05,iVar7 - this_03->probe_side_requirement);
  HashJoinGlobalSinkState::ScheduleFinalize
            (this_03,(Pipeline *)local_158._8_8_,(Event *)local_158._16_8_);
LAB_01562082:
  this_03->finalized = true;
  return READY;
}

Assistant:

SinkFinalizeType PhysicalHashJoin::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                            OperatorSinkFinalizeInput &input) const {
	auto &sink = input.global_state.Cast<HashJoinGlobalSinkState>();
	auto &ht = *sink.hash_table;

	sink.temporary_memory_state->UpdateReservation(context);
	sink.external = sink.temporary_memory_state->GetReservation() < sink.total_size;
	if (sink.external) {
		// For external join we reduce the load factor, this may even prevent the external join altogether
		ht.load_factor = JoinHashTable::EXTERNAL_LOAD_FACTOR;

		idx_t temp_max_partition_size;
		idx_t temp_max_partition_count;
		idx_t temp_total_size =
		    ht.GetTotalSize(sink.local_hash_tables, temp_max_partition_size, temp_max_partition_count);

		if (temp_total_size < sink.temporary_memory_state->GetReservation()) {
			// We prevented the external join by reducing the load factor. Update the state accordingly
			sink.temporary_memory_state->SetMinimumReservation(temp_total_size);
			sink.temporary_memory_state->SetRemainingSizeAndUpdateReservation(context, temp_total_size);

			sink.total_size = temp_total_size;
			sink.max_partition_size = temp_max_partition_size;
			sink.max_partition_count = temp_max_partition_count;

			sink.external = false;
		}
	}
	if (sink.external) {
		// External Hash Join
		sink.perfect_join_executor.reset();

		const auto max_partition_ht_size = sink.max_partition_size + ht.PointerTableSize(sink.max_partition_count);
		const auto very_very_skewed = // No point in repartitioning if it's this skewed
		    static_cast<double>(max_partition_ht_size) >= 0.8 * static_cast<double>(sink.total_size);
		if (!very_very_skewed &&
		    (max_partition_ht_size + sink.probe_side_requirement) > sink.temporary_memory_state->GetReservation()) {
			// We have to repartition
			ht.SetRepartitionRadixBits(sink.temporary_memory_state->GetReservation(), sink.max_partition_size,
			                           sink.max_partition_count);
			auto new_event = make_shared_ptr<HashJoinRepartitionEvent>(pipeline, *this, sink, sink.local_hash_tables);
			event.InsertEvent(std::move(new_event));
		} else {
			// No repartitioning!
			for (auto &local_ht : sink.local_hash_tables) {
				ht.Merge(*local_ht);
			}
			sink.local_hash_tables.clear();
			D_ASSERT(sink.temporary_memory_state->GetReservation() >= sink.probe_side_requirement);
			sink.hash_table->PrepareExternalFinalize(sink.temporary_memory_state->GetReservation() -
			                                         sink.probe_side_requirement);
			sink.ScheduleFinalize(pipeline, event);
		}
		sink.finalized = true;
		return SinkFinalizeType::READY;
	}

	// In-memory Hash Join
	for (auto &local_ht : sink.local_hash_tables) {
		ht.Merge(*local_ht);
	}
	sink.local_hash_tables.clear();
	ht.Unpartition();

	Value min;
	Value max;
	if (filter_pushdown && !sink.skip_filter_pushdown && ht.Count() > 0) {
		auto final_min_max = filter_pushdown->Finalize(context, ht, *sink.global_filter_state, *this);
		min = final_min_max->data[0].GetValue(0);
		max = final_min_max->data[1].GetValue(0);
	} else if (TypeIsIntegral(conditions[0].right->return_type.InternalType())) {
		min = Value::MinimumValue(conditions[0].right->return_type);
		max = Value::MaximumValue(conditions[0].right->return_type);
	}

	// check for possible perfect hash table
	auto use_perfect_hash = sink.perfect_join_executor->CanDoPerfectHashJoin(*this, min, max);
	if (use_perfect_hash) {
		D_ASSERT(ht.equality_types.size() == 1);
		auto key_type = ht.equality_types[0];
		use_perfect_hash = sink.perfect_join_executor->BuildPerfectHashTable(key_type);
	}
	// In case of a large build side or duplicates, use regular hash join
	if (!use_perfect_hash) {
		sink.perfect_join_executor.reset();
		sink.ScheduleFinalize(pipeline, event);
	}
	sink.finalized = true;
	if (ht.Count() == 0 && EmptyResultIfRHSIsEmpty()) {
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}
	return SinkFinalizeType::READY;
}